

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O0

void cornelich::util::touch(string *path)

{
  byte bVar1;
  undefined8 uVar2;
  runtime_error *this;
  streamer *this_00;
  streamer local_3c8;
  undefined1 local_240 [48];
  long local_210;
  ofstream f;
  string *path_local;
  
  uVar2 = std::__cxx11::string::c_str();
  std::ofstream::ofstream(&local_210,uVar2,0x10);
  bVar1 = std::ios::operator!((ios *)((long)&local_210 + *(long *)(local_210 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::ofstream::~ofstream(&local_210);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  streamer::streamer(&local_3c8);
  this_00 = streamer::operator<<(&local_3c8,(char (*) [28])"Failed to create/open file ");
  streamer::operator<<(this_00,path);
  streamer::operator_cast_to_string((streamer *)local_240);
  std::runtime_error::runtime_error(this,(string *)local_240);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void touch(const std::string & path)
{
    std::ofstream f(path.c_str());
    if (!f)
    {
        throw std::runtime_error(util::streamer() << "Failed to create/open file " << path);
    }
}